

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O0

Iterator * __thiscall icu_63::UCharsTrie::Iterator::reset(Iterator *this)

{
  __off_t in_RDX;
  uint local_14;
  int32_t length;
  Iterator *this_local;
  
  this->pos_ = this->initialPos_;
  this->remainingMatchLength_ = this->initialRemainingMatchLength_;
  this->skipValue_ = '\0';
  local_14 = this->remainingMatchLength_ + 1;
  if ((0 < this->maxLength_) && (this->maxLength_ < (int)local_14)) {
    local_14 = this->maxLength_;
  }
  UnicodeString::truncate(&this->str_,(char *)(ulong)local_14,in_RDX);
  this->pos_ = this->pos_ + (int)local_14;
  this->remainingMatchLength_ = this->remainingMatchLength_ - local_14;
  UVector32::setSize(this->stack_,0);
  return this;
}

Assistant:

UCharsTrie::Iterator &
UCharsTrie::Iterator::reset() {
    pos_=initialPos_;
    remainingMatchLength_=initialRemainingMatchLength_;
    skipValue_=FALSE;
    int32_t length=remainingMatchLength_+1;  // Remaining match length.
    if(maxLength_>0 && length>maxLength_) {
        length=maxLength_;
    }
    str_.truncate(length);
    pos_+=length;
    remainingMatchLength_-=length;
    stack_->setSize(0);
    return *this;
}